

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

void __thiscall QWizard::setCurrentId(QWizard *this,int id)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  QWizardPrivate *pQVar4;
  ulong uVar5;
  uint in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  QWizardPrivate *d;
  char *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  int *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  char local_30 [24];
  Direction in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = d_func((QWizard *)0x7bc52e);
  if (((pQVar4->current != -1) &&
      (uVar3 = currentId((QWizard *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)),
      uVar3 != in_ESI)) && (uVar5 = (**(code **)(*in_RDI + 0x1c8))(), (uVar5 & 1) != 0)) {
    if (((int)in_ESI < 0) ||
       (bVar2 = QMap<int,_QWizardPage_*>::contains
                          ((QMap<int,_QWizardPage_*> *)
                           CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                           in_stack_ffffffffffffffa8), ((bVar2 ^ 0xffU) & 1) != 0)) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (char *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                 in_stack_ffffffffffffff98);
      QMessageLogger::warning(local_30,"QWizard::setCurrentId: No such page: %d",(ulong)in_ESI);
    }
    else {
      currentId((QWizard *)CONCAT44(in_ESI,in_stack_ffffffffffffffa0));
      QWizardPrivate::switchToPage
                ((QWizardPrivate *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                 in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizard::setCurrentId(int id)
{
    Q_D(QWizard);

    if (d->current == -1)
        return;

    if (currentId() == id)
        return;

    if (!validateCurrentPage())
        return;

    if (id < 0 || Q_UNLIKELY(!d->pageMap.contains(id))) {
        qWarning("QWizard::setCurrentId: No such page: %d", id);
        return;
    }

    d->switchToPage(id, (id < currentId()) ? QWizardPrivate::Backward : QWizardPrivate::Forward);
}